

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O2

void __thiscall
CATCH2_INTERNAL_TEST_0()::TestSession::TestSession(FIX::Application&,FIX::MessageStoreFactory&,FIX::
SessionID_const&,FIX::DataDictionaryProvider&,FIX::TimeRange_const__int_
          (void *this,Application *app,MessageStoreFactory *factory,SessionID *sessionId,
          DataDictionaryProvider *provider,TimeRange *timeRange,int heartBtInt)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SocketConnectionTestCase.cpp:87:15)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SocketConnectionTestCase.cpp:87:15)>
             ::_M_manager;
  FIX::Session::Session((Session *)this,&local_28,app,factory,sessionId,provider,timeRange,1,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  *(undefined ***)this = &PTR__Session_002fe698;
  *(undefined8 *)((long)this + 0x878) = 0;
  *(undefined1 *)((long)this + 0x880) = 0;
  return;
}

Assistant:

TestSession(
        Application &app,
        MessageStoreFactory &factory,
        const SessionID &sessionId,
        DataDictionaryProvider &provider,
        const TimeRange &timeRange,
        int heartBtInt)
        : Session(
              []() { return UtcTimeStamp::now(); },
              app,
              factory,
              sessionId,
              provider,
              timeRange,
              heartBtInt,
              nullptr) {}